

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCutTrav.c
# Opt level: O3

void Ivy_NodeComputeVolumeTrav2_rec(Ivy_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  
  if ((pObj->field_0x8 & 0x10) != 0) {
    Ivy_NodeComputeVolumeTrav2_rec((Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vNodes);
    Ivy_NodeComputeVolumeTrav2_rec((Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vNodes);
    uVar1 = vNodes->nSize;
    if (uVar1 == vNodes->nCap) {
      if ((int)uVar1 < 0x10) {
        if (vNodes->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc(0x80);
        }
        else {
          ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
        }
        vNodes->pArray = ppvVar3;
        vNodes->nCap = 0x10;
      }
      else {
        if (vNodes->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
        }
        vNodes->pArray = ppvVar3;
        vNodes->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar3 = vNodes->pArray;
    }
    iVar2 = vNodes->nSize;
    vNodes->nSize = iVar2 + 1;
    ppvVar3[iVar2] = pObj;
  }
  return;
}

Assistant:

void Ivy_NodeComputeVolumeTrav2_rec( Ivy_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    if ( !pObj->fMarkA )
        return;
    Ivy_NodeComputeVolumeTrav2_rec( Ivy_ObjFanin0(pObj), vNodes );
    Ivy_NodeComputeVolumeTrav2_rec( Ivy_ObjFanin1(pObj), vNodes );
    Vec_PtrPush( vNodes, pObj );
}